

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cSparseTexture2Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::UncommittedRegionsAccessTestCase::verifyTextureDataExtended
          (UncommittedRegionsAccessTestCase *this,Functions *gl,GLint target,GLint format,
          GLuint *texture,GLint level,bool shaderOnly)

{
  undefined1 *this_00;
  pointer *__x;
  _Alloc_hider _Var1;
  undefined8 uVar2;
  Functions *pFVar3;
  pointer out_data;
  pointer __s;
  pointer puVar4;
  pointer pbVar5;
  GLenum GVar6;
  GLint GVar7;
  ostream *poVar8;
  size_t sVar9;
  TestError *this_01;
  GLint GVar10;
  undefined4 in_register_0000000c;
  TextureFormat *this_02;
  long lVar11;
  deUint32 dVar12;
  SparseTexture2CommitmentTestCase *this_03;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  bool bVar18;
  bool bVar19;
  size_type sVar20;
  GLint GVar21;
  GLint depth;
  GLint height;
  GLint width;
  int local_40c;
  TransferFormat local_408;
  Functions *local_400;
  GLuint verifyTexture;
  size_t local_3f0;
  pointer local_3e8;
  UncommittedRegionsAccessTestCase *local_3e0;
  GLint local_3d4;
  ulong local_3d0;
  size_t local_3c8;
  ostream *local_3c0;
  string shader;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecOutData;
  string local_378;
  string local_358;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vecExpData;
  ProgramSources sources;
  TokenStrings s;
  ShaderProgram program;
  
  local_3d0 = CONCAT44(in_register_0000000c,format);
  this_00 = &(this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
             field_0x88;
  local_400 = gl;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verify Texture [level: ",0x17);
  local_3c0 = (ostream *)this_00;
  poVar8 = (ostream *)std::ostream::operator<<(this_00,level);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
  if ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      levels + -1 < level) {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Invalid level",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
               ,0x676);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_408 = glu::getTransferFormat
                        ((this->super_SparseTexture2CommitmentTestCase).
                         super_SparseTextureCommitmentTestCase.mState.format);
  local_3f0 = CONCAT44(local_3f0._4_4_,target);
  SparseTextureUtils::getTextureLevelSize
            (target,&(this->super_SparseTexture2CommitmentTestCase).
                     super_SparseTextureCommitmentTestCase.mState,level,&width,&height,&depth);
  GVar21 = depth;
  bVar19 = true;
  if ((height != 0 && 2 < width + 1U) &&
     ((this->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.mState.
      minDepth <= depth)) {
    local_40c = width / 2;
    if (shaderOnly) {
      dVar12 = 0x8c1a;
      if ((GLenum)local_3f0 == 0x9100) {
        dVar12 = 0xde1;
      }
      local_408.format = dVar12;
      if ((GLenum)local_3f0 == 0x8513) {
        depth = depth * 6;
      }
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      sVar20 = (size_type)(height * width * depth);
      local_3e0 = this;
      local_3d4 = level;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecExpData,sVar20);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&vecOutData,sVar20);
      puVar4 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      __s = vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
      memset(vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start,0xff,sVar20);
      pFVar3 = local_400;
      gl4cts::Texture::Generate(local_400,&verifyTexture);
      gl4cts::Texture::Bind(pFVar3,verifyTexture,local_408.format);
      gl4cts::Texture::Storage(pFVar3,local_408.format,1,0x8229,width,height,depth);
      GVar6 = (*pFVar3->getError)();
      glu::checkError(GVar6,"Texture::Storage",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                      ,0x6f6);
      if ((local_3e0->super_SparseTexture2CommitmentTestCase).super_SparseTextureCommitmentTestCase.
          mState.samples < 1) {
        bVar19 = true;
      }
      else {
        bVar19 = true;
        local_3e8 = (pointer)((ulong)local_3e8 & 0xffffffff00000000);
        local_3c8 = sVar20;
        do {
          memset(__s,0,local_3c8);
          gl4cts::Texture::Bind(local_400,verifyTexture,local_408.format);
          gl4cts::Texture::SubImage
                    (local_400,local_408.format,0,0,0,0,width,height,depth,0x1903,0x1401,__s);
          GVar6 = (*local_400->getError)();
          glu::checkError(GVar6,"Texture::SubImage",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                          ,0x6ff);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&shader,st2_compute_textureVerify,(allocator<char> *)&s);
          local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"image","");
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          this_03 = (SparseTexture2CommitmentTestCase *)0x1baafe4;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"image","");
          SparseTexture2CommitmentTestCase::createShaderTokens
                    (&s,this_03,(GLenum)local_3f0,(GLint)local_3d0,(GLint)local_3e8,&local_378,
                     &local_358);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          replaceToken("<OUTPUT_TYPE>",s.outputType._M_dataplus._M_p,&shader);
          replaceToken("<FORMAT>",s.format._M_dataplus._M_p,&shader);
          replaceToken("<INPUT_TYPE>",s.inputType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_TYPE>",s.pointType._M_dataplus._M_p,&shader);
          replaceToken("<POINT_DEF>",s.pointDef._M_dataplus._M_p,&shader);
          replaceToken("<RETURN_TYPE>",s.returnType._M_dataplus._M_p,&shader);
          replaceToken("<SAMPLE_DEF>",s.sampleDef._M_dataplus._M_p,&shader);
          replaceToken("<RESULT_EXPECTED>",s.resultDefault._M_dataplus._M_p,&shader);
          replaceToken("<EPSILON>",s.epsilon._M_dataplus._M_p,&shader);
          memset(&sources,0,0xac);
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
          sources.transformFeedbackVaryings.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
          sources._193_8_ = 0;
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_start =
               (pointer)CONCAT44(program.m_shaders[0].
                                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,5);
          program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)(program.m_shaders + 1);
          __x = &program.m_shaders[0].
                 super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)__x,shader._M_dataplus._M_p,
                     shader._M_dataplus._M_p + shader._M_string_length);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(sources.sources +
                      ((ulong)program.m_shaders[0].
                              super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                              _M_impl.super__Vector_impl_data._M_start & 0xffffffff),
                      (value_type *)__x);
          if ((vector<glu::Shader_*,_std::allocator<glu::Shader_*>_> *)
              program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
              ._M_impl.super__Vector_impl_data._M_finish != program.m_shaders + 1) {
            operator_delete(program.m_shaders[0].
                            super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish,
                            (long)program.m_shaders[1].
                                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start + 1);
          }
          glu::ShaderProgram::ShaderProgram
                    (&program,((local_3e0->super_SparseTexture2CommitmentTestCase).
                               super_SparseTextureCommitmentTestCase.super_TestCase.m_context)->
                              m_renderCtx,&sources);
          pFVar3 = local_400;
          if (program.m_program.m_info.linkOk == true) {
            (*local_400->useProgram)(program.m_program.m_program);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glUseProgram",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x718);
            (*pFVar3->bindImageTexture)(0,verifyTexture,0,'\0',0,0x88b9,0x8232);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x71f);
            (*pFVar3->bindImageTexture)(1,*texture,local_3d4,'\0',0,35000,(GLenum)local_3d0);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glBindImageTexture",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x726);
            (*pFVar3->uniform1i)(1,0);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x728);
            (*pFVar3->uniform1i)(2,1);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glUniform1i",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72a);
            (*pFVar3->dispatchCompute)(width,height,depth);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glDispatchCompute",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72c);
            (*pFVar3->memoryBarrier)(0xffffffff);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"glMemoryBarrier",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x72e);
            gl4cts::Texture::GetData(pFVar3,0,local_408.format,0x1903,0x1401,__s);
            GVar6 = (*pFVar3->getError)();
            glu::checkError(GVar6,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x731);
            if (local_40c < width) {
              iVar13 = local_40c;
              do {
                if (0 < height) {
                  iVar14 = 0;
                  iVar15 = iVar13;
                  do {
                    uVar16 = (ulong)(uint)depth;
                    iVar17 = iVar15;
                    if (0 < depth) {
                      do {
                        if (puVar4[iVar17] != __s[iVar17]) {
                          bVar19 = false;
                        }
                        iVar17 = iVar17 + height * width;
                        uVar16 = uVar16 - 1;
                      } while (uVar16 != 0);
                    }
                    iVar14 = iVar14 + 1;
                    iVar15 = iVar15 + width;
                  } while (iVar14 != height);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 != width);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3c0,"Compute shader compilation failed (reading) for target: ",0x38);
            poVar8 = (ostream *)std::ostream::operator<<(local_3c0,(GLenum)local_3f0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", format: ",10);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)local_3d0);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", sample: ",10);
            poVar8 = (ostream *)std::ostream::operator<<(poVar8,(GLint)local_3e8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", infoLog: ",0xb);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar8,((*program.m_shaders[5].
                                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->m_info).
                                       infoLog._M_dataplus._M_p,
                                ((*program.m_shaders[5].
                                   super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->m_info).infoLog.
                                _M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,", shaderSource: ",0x10);
            _Var1 = shader._M_dataplus;
            if (shader._M_dataplus._M_p == (pointer)0x0) {
              std::ios::clear((int)poVar8 + (int)poVar8->_vptr_basic_ostream[-3]);
            }
            else {
              sVar9 = strlen(shader._M_dataplus._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar8,_Var1._M_p,sVar9);
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," - ",3);
            bVar19 = false;
          }
          glu::ShaderProgram::~ShaderProgram(&program);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&sources.transformFeedbackVaryings);
          std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
          ~vector(&sources.attribLocationBindings);
          lVar11 = 0x78;
          do {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)((long)&sources.sources[0].
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar11));
            lVar11 = lVar11 + -0x18;
          } while (lVar11 != -0x18);
          SparseTexture2CommitmentTestCase::TokenStrings::~TokenStrings(&s);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)shader._M_dataplus._M_p != &shader.field_2) {
            operator_delete(shader._M_dataplus._M_p,shader.field_2._M_allocated_capacity + 1);
          }
          iVar13 = (GLint)local_3e8 + 1;
          local_3e8 = (pointer)CONCAT44(local_3e8._4_4_,iVar13);
        } while (iVar13 < (local_3e0->super_SparseTexture2CommitmentTestCase).
                          super_SparseTextureCommitmentTestCase.mState.samples);
      }
      gl4cts::Texture::Delete(local_400,&verifyTexture);
      _Var1._M_p = (pointer)vecExpData.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
      uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
      if (vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vecOutData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)vecOutData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        _Var1._M_p = (pointer)vecExpData.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start;
        uVar2 = vecExpData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage;
      }
    }
    else {
      this_02 = &(this->super_SparseTexture2CommitmentTestCase).
                 super_SparseTextureCommitmentTestCase.mState.format;
      local_3c8 = (ulong)local_408 >> 0x20;
      local_3e0 = (UncommittedRegionsAccessTestCase *)this_02;
      if ((GLenum)local_3f0 == 0x8513) {
        s.format._M_dataplus._M_p = (pointer)0x0;
        s.format._M_string_length = 0;
        s.format.field_2._M_allocated_capacity = 0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8515);
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)&s,(iterator)0x0,(int *)&sources);
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8516);
        if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                     (int *)&sources);
        }
        else {
          *(undefined4 *)s.format._M_string_length = 0x8516;
          s.format._M_string_length = s.format._M_string_length + 4;
        }
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8517);
        if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                     (int *)&sources);
        }
        else {
          *(undefined4 *)s.format._M_string_length = 0x8517;
          s.format._M_string_length = s.format._M_string_length + 4;
        }
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8518);
        if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                     (int *)&sources);
        }
        else {
          *(undefined4 *)s.format._M_string_length = 0x8518;
          s.format._M_string_length = s.format._M_string_length + 4;
        }
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x8519);
        if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                     (int *)&sources);
        }
        else {
          *(undefined4 *)s.format._M_string_length = 0x8519;
          s.format._M_string_length = s.format._M_string_length + 4;
        }
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             (pointer)CONCAT44(sources.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._4_4_,0x851a);
        if (s.format._M_string_length == s.format.field_2._M_allocated_capacity) {
          local_3d4 = level;
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    ((vector<int,_std::allocator<int>_> *)&s,(iterator)s.format._M_string_length,
                     (int *)&sources);
        }
        else {
          *(undefined4 *)s.format._M_string_length = 0x851a;
          s.format._M_string_length = s.format._M_string_length + 4;
          local_3d4 = level;
        }
        GVar7 = width;
        GVar21 = height;
        iVar13 = tcu::TextureFormat::getPixelSize(this_02);
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sVar20 = (size_type)(GVar21 * GVar7 * iVar13);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar20);
        iVar13 = local_40c;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&program,sVar20);
        pbVar5 = sources.sources[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_3e8 = program.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        memset(sources.sources[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,0xff,sVar20);
        if ((pointer)s.format._M_string_length == s.format._M_dataplus._M_p) {
          bVar19 = true;
        }
        else {
          bVar19 = true;
          uVar16 = 0;
          local_3f0 = sVar20;
          do {
            sVar9 = local_3f0;
            GVar6 = *(GLenum *)(s.format._M_dataplus._M_p + uVar16 * 4);
            local_3d0 = uVar16;
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_3c0,"Verify Subtarget [subtarget: ",0x1d);
            poVar8 = (ostream *)std::ostream::operator<<(local_3c0,GVar6);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] - ",4);
            out_data = local_3e8;
            memset(local_3e8,0xff,sVar9);
            gl4cts::Texture::GetData
                      (local_400,local_3d4,GVar6,local_408.format,(GLenum)local_3c8,out_data);
            GVar6 = (*local_400->getError)();
            glu::checkError(GVar6,"Texture::GetData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                            ,0x6c7);
            GVar21 = width;
            iVar15 = height;
            if (iVar13 < width) {
              do {
                if (0 < iVar15) {
                  iVar14 = 0;
                  GVar7 = depth;
                  do {
                    if (0 < GVar7) {
                      iVar17 = 0;
                      do {
                        iVar15 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3e0);
                        GVar21 = width;
                        lVar11 = (long)((width * iVar14 + iVar13) * iVar15);
                        iVar15 = bcmp((void *)((long)&(pbVar5->_M_dataplus)._M_p + lVar11),
                                      (void *)(lVar11 + (long)local_3e8),(long)iVar15);
                        if (iVar15 != 0) {
                          bVar19 = false;
                        }
                        iVar17 = iVar17 + 1;
                        iVar15 = height;
                        GVar7 = depth;
                      } while (iVar17 < depth);
                    }
                    iVar14 = iVar14 + 1;
                  } while (iVar14 < iVar15);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < GVar21);
            }
          } while ((bVar19) &&
                  (uVar16 = local_3d0 + 1, iVar13 = local_40c,
                  uVar16 < (ulong)((long)(s.format._M_string_length -
                                         (long)s.format._M_dataplus._M_p) >> 2)));
        }
        if (program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(program.m_shaders[0].
                          super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)program.m_shaders[0].
                                super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
      }
      else {
        if ((GLenum)local_3f0 == 0x9100) {
          return true;
        }
        if ((GLenum)local_3f0 == 0x9102) {
          return true;
        }
        iVar15 = height * width;
        iVar13 = tcu::TextureFormat::getPixelSize(this_02);
        s.format.field_2._M_allocated_capacity = 0;
        s.format._M_dataplus._M_p = (pointer)0x0;
        s.format._M_string_length = 0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        sources.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        sVar20 = (size_type)(GVar21 * iVar13 * iVar15);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&s,sVar20);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sources,sVar20);
        _Var1 = s.format._M_dataplus;
        pbVar5 = sources.sources[0].
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        memset(s.format._M_dataplus._M_p,0,sVar20);
        memset(pbVar5,0xff,sVar20);
        pFVar3 = local_400;
        gl4cts::Texture::GetData
                  (local_400,level,(GLenum)local_3f0,local_408.format,(GLenum)local_3c8,pbVar5);
        GVar6 = (*pFVar3->getError)();
        glu::checkError(GVar6,"Texture::GetData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cSparseTexture2Tests.cpp"
                        ,0x699);
        bVar19 = true;
        if (local_40c < width) {
          bVar18 = true;
          bVar19 = true;
          GVar21 = width;
          GVar7 = height;
          do {
            if (0 < GVar7) {
              iVar13 = 0;
              GVar10 = depth;
              do {
                if (0 < GVar10) {
                  iVar15 = 0;
                  bVar19 = bVar18;
                  do {
                    iVar14 = tcu::TextureFormat::getPixelSize((TextureFormat *)local_3e0);
                    GVar21 = width;
                    lVar11 = (long)((width * iVar13 + local_40c) * iVar14);
                    iVar14 = bcmp(_Var1._M_p + lVar11,
                                  (void *)((long)&(pbVar5->_M_dataplus)._M_p + lVar11),(long)iVar14)
                    ;
                    if (iVar14 != 0) {
                      bVar19 = false;
                    }
                    iVar15 = iVar15 + 1;
                    GVar7 = height;
                    GVar10 = depth;
                    bVar18 = bVar19;
                  } while (iVar15 < depth);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < GVar7);
            }
            local_40c = local_40c + 1;
          } while (local_40c < GVar21);
        }
      }
      _Var1._M_p = s.format._M_dataplus._M_p;
      uVar2 = s.format.field_2._M_allocated_capacity;
      if (sources.sources[0].
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(sources.sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)sources.sources[0].
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        _Var1 = s.format._M_dataplus;
        uVar2 = s.format.field_2._M_allocated_capacity;
      }
    }
    if ((pointer)_Var1._M_p != (pointer)0x0) {
      operator_delete(_Var1._M_p,uVar2 - (long)_Var1._M_p);
    }
  }
  return bVar19;
}

Assistant:

bool UncommittedRegionsAccessTestCase::verifyTextureDataExtended(const Functions& gl, GLint target, GLint format,
																 GLuint& texture, GLint level, bool shaderOnly)
{
	mLog << "Verify Texture [level: " << level << "] - ";

	if (level > mState.levels - 1)
		TCU_FAIL("Invalid level");

	TransferFormat transferFormat = glu::getTransferFormat(mState.format);

	GLint width;
	GLint height;
	GLint depth;
	SparseTextureUtils::getTextureLevelSize(target, mState, level, width, height, depth);

	//Committed region is limited to 1/2 of width
	GLint widthCommitted = width / 2;

	if (widthCommitted == 0 || height == 0 || depth < mState.minDepth)
		return true;

	bool result = true;

	// Verify texture using API glGetTexImage* (Skip multisample textures as it can not be verified using API)
	if (!shaderOnly && target != GL_TEXTURE_CUBE_MAP && target != GL_TEXTURE_2D_MULTISAMPLE &&
		target != GL_TEXTURE_2D_MULTISAMPLE_ARRAY)
	{
		GLint texSize = width * height * depth * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 0 because atomic operations result on uncommitted regions are zeros
		deMemset(exp_data, 0, texSize);
		deMemset(out_data, 255, texSize);

		Texture::GetData(gl, level, target, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

		//Verify only committed region
		for (GLint x = widthCommitted; x < width; ++x)
			for (GLint y = 0; y < height; ++y)
				for (GLint z = 0; z < depth; ++z)
				{
					int		 pixelSize	 = mState.format.getPixelSize();
					GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
					GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
					if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
						result = false;
				}
	}
	// Verify texture using API glGetTexImage* (Only cube map as it has to be verified for subtargets)
	else if (!shaderOnly && target == GL_TEXTURE_CUBE_MAP)
	{
		std::vector<GLint> subTargets;

		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_X);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Y);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_POSITIVE_Z);
		subTargets.push_back(GL_TEXTURE_CUBE_MAP_NEGATIVE_Z);

		GLint texSize = width * height * mState.format.getPixelSize();

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		deMemset(exp_data, 255, texSize);

		for (size_t i = 0; i < subTargets.size(); ++i)
		{
			GLint subTarget = subTargets[i];

			mLog << "Verify Subtarget [subtarget: " << subTarget << "] - ";

			deMemset(out_data, 255, texSize);

			Texture::GetData(gl, level, subTarget, transferFormat.format, transferFormat.dataType, (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

			//Verify only committed region
			for (GLint x = widthCommitted; x < width; ++x)
				for (GLint y = 0; y < height; ++y)
					for (GLint z = 0; z < depth; ++z)
					{
						int		 pixelSize	 = mState.format.getPixelSize();
						GLubyte* dataRegion	= exp_data + ((x + y * width) * pixelSize);
						GLubyte* outDataRegion = out_data + ((x + y * width) * pixelSize);
						if (deMemCmp(dataRegion, outDataRegion, pixelSize) != 0)
							result = false;
					}

			if (!result)
				break;
		}
	}
	// Verify texture using shader imageLoad function
	else if (shaderOnly)
	{
		// Create verifying texture
		GLint verifyTarget;
		if (target == GL_TEXTURE_2D_MULTISAMPLE)
			verifyTarget = GL_TEXTURE_2D;
		else
			verifyTarget = GL_TEXTURE_2D_ARRAY;

		if (target == GL_TEXTURE_CUBE_MAP)
			depth = depth * 6;

		GLint texSize = width * height * depth;

		std::vector<GLubyte> vecExpData;
		std::vector<GLubyte> vecOutData;
		vecExpData.resize(texSize);
		vecOutData.resize(texSize);
		GLubyte* exp_data = vecExpData.data();
		GLubyte* out_data = vecOutData.data();

		// Expected value in this case is 255 because shader fills output texture with 255 if in texture is filled with zeros
		deMemset(exp_data, 255, texSize);

		GLuint verifyTexture;
		Texture::Generate(gl, verifyTexture);
		Texture::Bind(gl, verifyTexture, verifyTarget);
		Texture::Storage(gl, verifyTarget, 1, GL_R8, width, height, depth);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::Storage");

		for (GLint sample = 0; sample < mState.samples; ++sample)
		{
			deMemset(out_data, 0, texSize);

			Texture::Bind(gl, verifyTexture, verifyTarget);
			Texture::SubImage(gl, verifyTarget, 0, 0, 0, 0, width, height, depth, GL_RED, GL_UNSIGNED_BYTE,
							  (GLvoid*)out_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::SubImage");

			std::string shader = st2_compute_textureVerify;

			// Adjust shader source to texture format
			TokenStrings s = createShaderTokens(target, format, sample);

			replaceToken("<OUTPUT_TYPE>", s.outputType.c_str(), shader);
			replaceToken("<FORMAT>", s.format.c_str(), shader);
			replaceToken("<INPUT_TYPE>", s.inputType.c_str(), shader);
			replaceToken("<POINT_TYPE>", s.pointType.c_str(), shader);
			replaceToken("<POINT_DEF>", s.pointDef.c_str(), shader);
			replaceToken("<RETURN_TYPE>", s.returnType.c_str(), shader);
			replaceToken("<SAMPLE_DEF>", s.sampleDef.c_str(), shader);
			replaceToken("<RESULT_EXPECTED>", s.resultDefault.c_str(), shader);
			replaceToken("<EPSILON>", s.epsilon.c_str(), shader);

			ProgramSources sources;
			sources << ComputeSource(shader);

			// Build and run shader
			ShaderProgram program(m_context.getRenderContext(), sources);
			if (program.isOk())
			{
				gl.useProgram(program.getProgram());
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram");
				gl.bindImageTexture(0, //unit
									verifyTexture,
									0,		  //level
									GL_FALSE, //layered
									0,		  //layer
									GL_WRITE_ONLY, GL_R8UI);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.bindImageTexture(1, //unit
									texture,
									level,	//level
									GL_FALSE, //layered
									0,		  //layer
									GL_READ_ONLY, format);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture");
				gl.uniform1i(1, 0 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.uniform1i(2, 1 /* image_unit */);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUniform1i");
				gl.dispatchCompute(width, height, depth);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute");
				gl.memoryBarrier(GL_ALL_BARRIER_BITS);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier");

				Texture::GetData(gl, 0, verifyTarget, GL_RED, GL_UNSIGNED_BYTE, (GLvoid*)out_data);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Texture::GetData");

				//Verify only committed region
				for (GLint x = widthCommitted; x < width; ++x)
					for (GLint y = 0; y < height; ++y)
						for (GLint z = 0; z < depth; ++z)
						{
							GLubyte* dataRegion	= exp_data + ((x + y * width) + z * width * height);
							GLubyte* outDataRegion = out_data + ((x + y * width) + z * width * height);
							if (dataRegion[0] != outDataRegion[0])
								result = false;
						}
			}
			else
			{
				mLog << "Compute shader compilation failed (reading) for target: " << target << ", format: " << format
					 << ", sample: " << sample << ", infoLog: " << program.getShaderInfo(SHADERTYPE_COMPUTE).infoLog
					 << ", shaderSource: " << shader.c_str() << " - ";

				result = false;
			}
		}

		Texture::Delete(gl, verifyTexture);
	}

	return result;
}